

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImVec2 IVar11;
  ImVec4 *pIVar12;
  ImVec2 IVar13;
  byte bVar14;
  ulong uVar15;
  undefined8 *puVar16;
  ImVec2 *pIVar17;
  ImDrawIdx IVar18;
  ImDrawVert *pIVar19;
  ImDrawIdx IVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  ImDrawIdx IVar24;
  int iVar25;
  ImDrawIdx *pIVar26;
  undefined7 in_register_00000081;
  ImDrawIdx IVar27;
  int iVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ImDrawIdx IVar33;
  bool bVar34;
  undefined4 in_XMM0_Db;
  ImVec2 IVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float afStack_a8 [4];
  undefined8 local_98;
  float afStack_90 [4];
  undefined8 local_80;
  undefined8 local_78;
  int local_64;
  undefined4 local_60;
  int local_5c;
  float local_58;
  uint local_44;
  undefined8 *local_40;
  byte local_31;
  
  if (1 < points_count) {
    IVar11 = this->_Data->TexUvWhitePixel;
    local_80 = (ulong)(points_count - 1U);
    local_40 = (undefined8 *)(ulong)(points_count - 1U);
    if (closed) {
      local_40 = (undefined8 *)(ulong)(uint)points_count;
    }
    iVar28 = (int)local_40;
    if ((this->Flags & 1U) == 0) {
      afStack_a8[2] = 1.889006e-39;
      afStack_a8[3] = 0.0;
      local_58 = thickness;
      PrimReserve(this,iVar28 * 6,iVar28 * 4);
      uVar32 = 1;
      do {
        uVar15 = uVar32 & 0xffffffff;
        if ((uint)points_count == uVar32) {
          uVar15 = 0;
        }
        fVar7 = points[uVar32 - 1].x;
        fVar4 = points[uVar15].x - fVar7;
        fVar8 = points[uVar32 - 1].y;
        fVar3 = points[uVar15].y - fVar8;
        fVar36 = fVar4 * fVar4 + fVar3 * fVar3;
        if (0.0 < fVar36) {
          fVar36 = 1.0 / SQRT(fVar36);
          fVar3 = fVar3 * fVar36;
          fVar4 = fVar4 * fVar36;
        }
        fVar3 = fVar3 * local_58 * 0.5;
        fVar4 = fVar4 * local_58 * 0.5;
        pIVar19 = this->_VtxWritePtr;
        IVar35.y = fVar8 - fVar4;
        IVar35.x = fVar7 + fVar3;
        pIVar19->pos = IVar35;
        pIVar19->uv = IVar11;
        pIVar19 = this->_VtxWritePtr;
        pIVar19->col = col;
        pIVar19[1].pos.x = points[uVar15].x + fVar3;
        pIVar19[1].pos.y = points[uVar15].y - fVar4;
        pIVar19[1].uv = IVar11;
        pIVar19 = this->_VtxWritePtr;
        pIVar19[1].col = col;
        pIVar19[2].pos.x = points[uVar15].x - fVar3;
        pIVar19[2].pos.y = points[uVar15].y + fVar4;
        pIVar19[2].uv = IVar11;
        pIVar19 = this->_VtxWritePtr;
        pIVar19[2].col = col;
        pIVar19[3].pos.x = points[uVar32 - 1].x - fVar3;
        pIVar19[3].pos.y = points[uVar32 - 1].y + fVar4;
        pIVar19[3].uv = IVar11;
        pIVar19 = this->_VtxWritePtr;
        pIVar19[3].col = col;
        this->_VtxWritePtr = pIVar19 + 4;
        uVar30 = this->_VtxCurrentIdx;
        pIVar26 = this->_IdxWritePtr;
        IVar24 = (ImDrawIdx)uVar30;
        *pIVar26 = IVar24;
        pIVar26[1] = IVar24 + 1;
        pIVar26[2] = IVar24 + 2;
        pIVar26[3] = IVar24;
        pIVar26[4] = IVar24 + 2;
        pIVar26[5] = IVar24 + 3;
        this->_IdxWritePtr = pIVar26 + 6;
        this->_VtxCurrentIdx = uVar30 + 4;
        bVar34 = uVar32 != ((ulong)local_40 & 0xffffffff);
        uVar32 = uVar32 + 1;
      } while (bVar34);
    }
    else {
      local_60 = (undefined4)CONCAT71(in_register_00000081,closed);
      local_44 = col & 0xffffff;
      local_98._0_4_ = thickness;
      if (thickness <= 1.0) {
        local_98._0_4_ = 1.0;
      }
      local_5c = (int)(float)local_98;
      local_78 = CONCAT44(in_XMM0_Db,(float)local_98);
      local_98._0_4_ = (float)local_98 - (float)local_5c;
      bVar14 = (float)local_98 <= 1e-05 & local_5c < 0x3f & (byte)this->Flags >> 1;
      local_58 = (float)CONCAT31(local_58._1_3_,bVar14);
      local_31 = thickness <= 1.0;
      iVar25 = 0x12;
      if (thickness <= 1.0) {
        iVar25 = 0xc;
      }
      local_64 = points_count * 3;
      if (1.0 < thickness) {
        local_64 = points_count * 4;
      }
      iVar21 = 6;
      if (bVar14 == 0) {
        iVar21 = iVar25;
      }
      if (bVar14 != 0) {
        local_64 = points_count * 2;
      }
      afStack_a8[2] = 1.88978e-39;
      afStack_a8[3] = 0.0;
      PrimReserve(this,iVar21 * iVar28,local_64);
      bVar14 = local_31 | local_58._0_1_;
      lVar23 = -((ulong)(((uint)(bVar14 ^ 1) * 2 + 3) * points_count) * 8 + 0xf & 0xfffffffffffffff0
                );
      puVar16 = (undefined8 *)((long)afStack_90 + lVar23 + -8);
      uVar15 = (ulong)(uint)points_count;
      pfVar1 = (float *)(puVar16 + uVar15);
      uVar22 = (ulong)local_40 & 0xffffffff;
      uVar32 = 1;
      do {
        uVar29 = uVar32 & 0xffffffff;
        if (uVar15 == uVar32) {
          uVar29 = 0;
        }
        fVar3 = points[uVar29].x - points[uVar32 - 1].x;
        fVar4 = points[uVar29].y - points[uVar32 - 1].y;
        fVar7 = fVar3 * fVar3 + fVar4 * fVar4;
        if (0.0 < fVar7) {
          fVar7 = 1.0 / SQRT(fVar7);
          fVar3 = fVar3 * fVar7;
          fVar4 = fVar4 * fVar7;
        }
        *(float *)((long)afStack_a8 + uVar32 * 8 + lVar23 + 8) = fVar4;
        *(float *)((long)afStack_a8 + uVar32 * 8 + lVar23 + 0xc) = -fVar3;
        bVar34 = uVar32 != uVar22;
        uVar32 = uVar32 + 1;
      } while (bVar34);
      local_40 = puVar16;
      if ((char)local_60 == '\0') {
        uVar32 = local_80 & 0xffffffff;
        puVar16[uVar32] = *(undefined8 *)(pfVar1 + -4);
        fVar3 = points[uVar32].x;
        fVar4 = points[uVar32].y;
        if (bVar14 != 0) {
          if (local_58._0_1_ == '\0') {
            fVar7 = 1.0;
          }
          else {
            fVar7 = (float)local_78 * 0.5 + 1.0;
          }
          fVar8 = (float)*puVar16 * fVar7;
          fVar36 = (float)((ulong)*puVar16 >> 0x20) * fVar7;
          fVar37 = (*points).x;
          fVar40 = (*points).y;
          *pfVar1 = fVar8 + fVar37;
          pfVar1[1] = fVar36 + fVar40;
          pfVar1[2] = fVar37 - fVar8;
          pfVar1[3] = fVar40 - fVar36;
          uVar29 = (ulong)(uint)((int)local_80 * 2);
          *(ulong *)(pfVar1 + uVar29 * 2) =
               CONCAT44((float)((ulong)puVar16[uVar32] >> 0x20) * fVar7 + fVar4,
                        (float)puVar16[uVar32] * fVar7 + fVar3);
          *(ulong *)(pfVar1 + uVar29 * 2 + 2) =
               CONCAT44(fVar4 - (float)((ulong)puVar16[uVar32] >> 0x20) * fVar7,
                        fVar3 - (float)puVar16[uVar32] * fVar7);
          goto LAB_0014981f;
        }
        local_58 = (float)col;
        fVar41 = ((float)local_78 + -1.0) * 0.5;
        fVar7 = fVar41 + 1.0;
        fVar8 = (float)*puVar16;
        fVar36 = (float)((ulong)*puVar16 >> 0x20);
        fVar37 = fVar8 * fVar7;
        fVar40 = fVar36 * fVar7;
        fVar38 = (*points).x;
        fVar39 = (*points).y;
        fVar8 = fVar8 * fVar41;
        fVar36 = fVar36 * fVar41;
        *pfVar1 = fVar37 + fVar38;
        pfVar1[1] = fVar40 + fVar39;
        pfVar1[2] = fVar8 + fVar38;
        pfVar1[3] = fVar36 + fVar39;
        pfVar1[4] = fVar38 - fVar8;
        pfVar1[5] = fVar39 - fVar36;
        pfVar1[6] = fVar38 - fVar37;
        pfVar1[7] = fVar39 - fVar40;
        uVar29 = (ulong)(uint)((int)local_80 << 2);
        *(ulong *)(pfVar1 + uVar29 * 2) =
             CONCAT44((float)((ulong)puVar16[uVar32] >> 0x20) * fVar7 + fVar4,
                      (float)puVar16[uVar32] * fVar7 + fVar3);
        *(ulong *)(pfVar1 + uVar29 * 2 + 2) =
             CONCAT44((float)((ulong)puVar16[uVar32] >> 0x20) * fVar41 + fVar4,
                      (float)puVar16[uVar32] * fVar41 + fVar3);
        *(ulong *)(pfVar1 + uVar29 * 2 + 4) =
             CONCAT44(fVar4 - (float)((ulong)puVar16[uVar32] >> 0x20) * fVar41,
                      fVar3 - (float)puVar16[uVar32] * fVar41);
        *(ulong *)(pfVar1 + uVar29 * 2 + 6) =
             CONCAT44(fVar4 - (float)((ulong)puVar16[uVar32] >> 0x20) * fVar7,
                      fVar3 - (float)puVar16[uVar32] * fVar7);
      }
      else {
        if (bVar14 != 0) {
          fVar7 = 1.0;
          if (local_58._0_1_ != '\0') {
            fVar7 = (float)local_78 * 0.5 + 1.0;
          }
LAB_0014981f:
          local_78 = (ulong)((uint)local_58 & 0xff ^ 3);
          pIVar26 = this->_IdxWritePtr;
          uVar32 = 1;
          uVar30 = this->_VtxCurrentIdx;
LAB_00149853:
          uVar29 = uVar32 & 0xffffffff;
          if (uVar15 == uVar32) {
            uVar29 = 0;
          }
          uVar31 = uVar30 + (int)local_78;
          if (uVar15 == uVar32) {
            uVar31 = this->_VtxCurrentIdx;
          }
          fVar36 = points[uVar29].x;
          fVar37 = points[uVar29].y;
          fVar4 = ((float)puVar16[uVar29] + (float)puVar16[uVar32 - 1]) * 0.5;
          fVar8 = ((float)((ulong)puVar16[uVar29] >> 0x20) +
                  (float)((ulong)puVar16[uVar32 - 1] >> 0x20)) * 0.5;
          fVar40 = fVar4 * fVar4 + fVar8 * fVar8;
          fVar3 = 0.5;
          if (0.5 <= fVar40) {
            fVar3 = fVar40;
          }
          fVar4 = (1.0 / fVar3) * fVar4 * fVar7;
          fVar3 = (1.0 / fVar3) * fVar8 * fVar7;
          pfVar2 = pfVar1 + (ulong)(uint)((int)uVar29 * 2) * 2;
          *pfVar2 = fVar4 + fVar36;
          pfVar2[1] = fVar3 + fVar37;
          pfVar2[2] = fVar36 - fVar4;
          pfVar2[3] = fVar37 - fVar3;
          IVar24 = (ImDrawIdx)uVar31;
          *pIVar26 = IVar24;
          IVar33 = (ImDrawIdx)uVar30;
          pIVar26[1] = IVar33;
          if (local_58._0_1_ == '\0') {
            pIVar26[2] = IVar33 + 2;
            pIVar26[3] = IVar33 + 2;
            pIVar26[4] = IVar24 + 2;
            pIVar26[5] = IVar24;
            pIVar26[6] = IVar24 + 1;
            pIVar26[7] = IVar33 + 1;
            pIVar26[8] = IVar33;
            pIVar26[9] = IVar33;
            pIVar26[10] = IVar24;
            pIVar26[0xb] = IVar24 + 1;
            pIVar26 = pIVar26 + 0xc;
            this->_IdxWritePtr = pIVar26;
            puVar16 = local_40;
            if (uVar22 != uVar32) goto LAB_00149968;
            pIVar19 = this->_VtxWritePtr;
            pIVar17 = (ImVec2 *)(local_40 + uVar15 + 1);
            uVar32 = 0;
            do {
              pIVar19->pos = points[uVar32];
              this->_VtxWritePtr->uv = IVar11;
              pIVar19 = this->_VtxWritePtr;
              pIVar19->col = col;
              pIVar19[1].pos = pIVar17[-1];
              this->_VtxWritePtr[1].uv = IVar11;
              pIVar19 = this->_VtxWritePtr;
              pIVar19[1].col = local_44;
              pIVar19[2].pos = *pIVar17;
              this->_VtxWritePtr[2].uv = IVar11;
              pIVar19 = this->_VtxWritePtr;
              pIVar19[2].col = local_44;
              pIVar19 = pIVar19 + 3;
              this->_VtxWritePtr = pIVar19;
              uVar32 = uVar32 + 1;
              pIVar17 = pIVar17 + 2;
            } while (uVar15 != uVar32);
          }
          else {
            pIVar26[2] = IVar33 + 1;
            pIVar26[3] = IVar24 + 1;
            pIVar26[4] = IVar33 + 1;
            pIVar26[5] = IVar24;
            pIVar26 = pIVar26 + 6;
            this->_IdxWritePtr = pIVar26;
            if (uVar22 != uVar32) goto LAB_00149968;
            pIVar12 = this->_Data->TexUvLines;
            lVar23 = (long)local_5c;
            fVar3 = pIVar12[lVar23].x;
            fVar7 = pIVar12[lVar23].y;
            fVar4 = pIVar12[lVar23].z;
            fVar8 = pIVar12[lVar23].w;
            if (((float)local_98 != 0.0) || (NAN((float)local_98))) {
              uVar5 = pIVar12[lVar23 + 1].x;
              uVar9 = pIVar12[lVar23 + 1].y;
              uVar6 = pIVar12[lVar23 + 1].z;
              uVar10 = pIVar12[lVar23 + 1].w;
              fVar3 = fVar3 + ((float)uVar5 - fVar3) * (float)local_98;
              fVar7 = fVar7 + ((float)uVar9 - fVar7) * (float)local_98;
              fVar4 = fVar4 + ((float)uVar6 - fVar4) * (float)local_98;
              fVar8 = fVar8 + ((float)uVar10 - fVar8) * (float)local_98;
            }
            pIVar19 = this->_VtxWritePtr;
            pIVar17 = (ImVec2 *)(puVar16 + uVar15 + 1);
            do {
              pIVar19->pos = pIVar17[-1];
              IVar11.y = fVar7;
              IVar11.x = fVar3;
              this->_VtxWritePtr->uv = IVar11;
              pIVar19 = this->_VtxWritePtr;
              pIVar19->col = col;
              pIVar19[1].pos = *pIVar17;
              IVar13.y = fVar8;
              IVar13.x = fVar4;
              this->_VtxWritePtr[1].uv = IVar13;
              pIVar19 = this->_VtxWritePtr;
              pIVar19[1].col = col;
              pIVar19 = pIVar19 + 2;
              this->_VtxWritePtr = pIVar19;
              pIVar17 = pIVar17 + 2;
              uVar15 = uVar15 - 1;
            } while (uVar15 != 0);
          }
          goto LAB_00149a7e;
        }
        local_58 = (float)col;
        fVar41 = ((float)local_78 + -1.0) * 0.5;
      }
      pIVar26 = this->_IdxWritePtr;
      uVar32 = 1;
      uVar30 = this->_VtxCurrentIdx;
      do {
        uVar29 = uVar32 & 0xffffffff;
        if (uVar15 == uVar32) {
          uVar29 = 0;
        }
        fVar4 = ((float)puVar16[uVar29] + (float)puVar16[uVar32 - 1]) * 0.5;
        fVar7 = ((float)((ulong)puVar16[uVar29] >> 0x20) +
                (float)((ulong)puVar16[uVar32 - 1] >> 0x20)) * 0.5;
        fVar8 = fVar4 * fVar4 + fVar7 * fVar7;
        fVar3 = 0.5;
        if (0.5 <= fVar8) {
          fVar3 = fVar8;
        }
        uVar31 = uVar30 + 4;
        if (uVar15 == uVar32) {
          uVar31 = this->_VtxCurrentIdx;
        }
        fVar3 = 1.0 / fVar3;
        fVar37 = points[uVar29].x;
        fVar40 = points[uVar29].y;
        fVar8 = fVar4 * fVar3 * (fVar41 + 1.0);
        fVar36 = fVar7 * fVar3 * (fVar41 + 1.0);
        fVar4 = fVar4 * fVar3 * fVar41;
        fVar3 = fVar7 * fVar3 * fVar41;
        uVar29 = (ulong)(uint)((int)uVar29 << 2);
        pfVar2 = pfVar1 + uVar29 * 2;
        *pfVar2 = fVar37 + fVar8;
        pfVar2[1] = fVar40 + fVar36;
        pfVar2[2] = fVar37 + fVar4;
        pfVar2[3] = fVar40 + fVar3;
        IVar24 = (ImDrawIdx)uVar31;
        IVar20 = IVar24 + 1;
        pfVar2 = pfVar1 + uVar29 * 2 + 4;
        *pfVar2 = fVar37 - fVar4;
        pfVar2[1] = fVar40 - fVar3;
        pfVar2[2] = fVar37 - fVar8;
        pfVar2[3] = fVar40 - fVar36;
        *pIVar26 = IVar20;
        IVar33 = (ImDrawIdx)uVar30;
        IVar27 = IVar33 + 2;
        pIVar26[1] = IVar33 + 1;
        pIVar26[2] = IVar27;
        pIVar26[3] = IVar27;
        IVar18 = IVar24 + 2;
        pIVar26[4] = IVar18;
        pIVar26[5] = IVar20;
        pIVar26[6] = IVar20;
        pIVar26[7] = IVar33 + 1;
        pIVar26[8] = IVar33;
        pIVar26[9] = IVar33;
        pIVar26[10] = IVar24;
        pIVar26[0xb] = IVar20;
        pIVar26[0xc] = IVar18;
        pIVar26[0xd] = IVar27;
        pIVar26[0xe] = IVar33 + 3;
        pIVar26[0xf] = IVar33 + 3;
        pIVar26[0x10] = IVar24 + 3;
        pIVar26[0x11] = IVar18;
        pIVar26 = pIVar26 + 0x12;
        bVar34 = uVar32 != uVar22;
        puVar16 = local_40;
        uVar32 = uVar32 + 1;
        uVar30 = uVar31;
      } while (bVar34);
      this->_IdxWritePtr = pIVar26;
      pIVar19 = this->_VtxWritePtr;
      pIVar17 = (ImVec2 *)(local_40 + uVar15 + 3);
      do {
        pIVar19->pos = pIVar17[-3];
        this->_VtxWritePtr->uv = IVar11;
        pIVar19 = this->_VtxWritePtr;
        pIVar19->col = local_44;
        pIVar19[1].pos = pIVar17[-2];
        this->_VtxWritePtr[1].uv = IVar11;
        pIVar19 = this->_VtxWritePtr;
        pIVar19[1].col = (ImU32)local_58;
        pIVar19[2].pos = pIVar17[-1];
        this->_VtxWritePtr[2].uv = IVar11;
        pIVar19 = this->_VtxWritePtr;
        pIVar19[2].col = (ImU32)local_58;
        pIVar19[3].pos = *pIVar17;
        this->_VtxWritePtr[3].uv = IVar11;
        pIVar19 = this->_VtxWritePtr;
        pIVar19[3].col = local_44;
        pIVar19 = pIVar19 + 4;
        this->_VtxWritePtr = pIVar19;
        pIVar17 = pIVar17 + 4;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
LAB_00149a7e:
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_64;
    }
  }
  return;
LAB_00149968:
  uVar32 = uVar32 + 1;
  uVar30 = uVar31;
  goto LAB_00149853;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > 1.0f);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                if (fractional_thickness != 0.0f)
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}